

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UnicodeFunctor * __thiscall icu_63::UnicodeSet::cloneAsThawed(UnicodeSet *this)

{
  UnicodeSet *this_00;
  size_t in_RSI;
  undefined8 local_30;
  UnicodeSet *this_local;
  
  this_00 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,in_RSI);
  local_30 = (UnicodeSet *)0x0;
  if (this_00 != (UnicodeSet *)0x0) {
    UnicodeSet(this_00,this,'\x01');
    local_30 = this_00;
  }
  return (UnicodeFunctor *)local_30;
}

Assistant:

UnicodeFunctor *UnicodeSet::cloneAsThawed() const {
    return new UnicodeSet(*this, TRUE);
}